

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void parse_filename(string *file_name,string *part_name,bool *force_part_name,int *part_num)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  invalid_argument *this;
  string *in_RCX;
  undefined1 *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string num;
  size_t colon;
  size_t doublecolon;
  string *in_stack_ffffffffffffff50;
  string local_90 [32];
  long local_70;
  string local_68 [32];
  string local_48 [32];
  long local_28;
  
  *in_RDX = 0;
  std::__cxx11::string::operator=(in_RSI,in_RDI);
  local_28 = std::__cxx11::string::rfind((char *)in_RDI,0x11c042);
  if (local_28 == -1) {
    parse_partname(in_RCX);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RSI,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::substr((ulong)local_68,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
    *in_RDX = 1;
  }
  local_70 = std::__cxx11::string::rfind((char)in_RDI,0x3a);
  if (local_70 == -1) {
    *(int *)in_RCX = -1;
  }
  else {
    std::__cxx11::string::substr((ulong)local_90,(ulong)in_RDI);
    bVar1 = is_number(in_stack_ffffffffffffff50);
    if (!bVar1) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"part number must be a number");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    *(int *)in_RCX = iVar2;
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff50,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,(string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string(local_90);
  }
  return;
}

Assistant:

void
parse_filename (
    string& file_name, string& part_name, bool& force_part_name, int& part_num)
{
    force_part_name    = false;
    part_name          = file_name; // default is the file_name
    size_t doublecolon = file_name.rfind ("::");
    if (doublecolon != string::npos)
    {
        part_name       = file_name.substr (doublecolon + 2);
        file_name       = file_name.substr (0, doublecolon);
        force_part_name = true;
    }
    else
    {
        parse_partname (part_name);
    }

    size_t colon = file_name.rfind (':');
    if (colon == string::npos)
    {
        part_num = -1; // use all parts
    }
    else
    {
        string num = file_name.substr (colon + 1);
        if (is_number (num))
        {
            part_num  = atoi (num.c_str ());
            file_name = file_name.substr (0, colon);
        }
        else
        {
            throw invalid_argument("part number must be a number");
    }
    }
}